

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<ScriptAstNode>_> * __thiscall
Parser::parseScript(optional<std::shared_ptr<ScriptAstNode>_> *__return_storage_ptr__,Parser *this)

{
  TokenType TVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<StatementAstNode> *__x;
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  local_90;
  undefined1 local_78 [8];
  optional<std::shared_ptr<StatementAstNode>_> statement;
  undefined1 local_48 [4];
  TokenType t;
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  undefined1 local_28 [7];
  bool error;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  TokenBuffer::nextToken((TokenBuffer *)local_28);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_28);
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
          *)local_48);
  while( true ) {
    skipWhiteSpace(this);
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
    TokenBuffer::currentToken
              ((TokenBuffer *)
               &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
    peVar3 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &statement.
                         super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                         _M_payload.
                         super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                         .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.
                         _M_engaged);
    TVar1 = peVar3->tokenType;
    std::shared_ptr<Token>::~shared_ptr
              ((shared_ptr<Token> *)
               &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
                super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged);
    if (TVar1 == EndOfFile) break;
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_78,this);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_78);
    if (bVar2) {
      __x = std::optional<std::shared_ptr<StatementAstNode>_>::value
                      ((optional<std::shared_ptr<StatementAstNode>_> *)local_78);
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)local_48,__x);
    }
    else {
      statements.
      super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    std::optional<std::shared_ptr<StatementAstNode>_>::~optional
              ((optional<std::shared_ptr<StatementAstNode>_> *)local_78);
  }
  if ((statements.
       super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    make_shared<ScriptAstNode,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
              (&local_90);
    std::optional<std::shared_ptr<ScriptAstNode>_>::optional<std::shared_ptr<ScriptAstNode>,_true>
              (__return_storage_ptr__,(shared_ptr<ScriptAstNode> *)&local_90);
    std::shared_ptr<ScriptAstNode>::~shared_ptr((shared_ptr<ScriptAstNode> *)&local_90);
  }
  else {
    std::optional<std::shared_ptr<ScriptAstNode>_>::optional(__return_storage_ptr__);
  }
  local_90.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  ~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           *)local_48);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ScriptAstNode>>
Parser::parseScript() noexcept {

  // we're assuming were before the start of the tape,
  // move the tape to the first token
  this->tokenBuffer->nextToken();

  bool error = false;
  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    TokenType t = this->tokenBuffer->currentToken()->tokenType;

    if (t == TokenType::EndOfFile) {
      break;
    }

    auto statement = this->parseStatement();

    if (statement) {
      statements.push_back(statement.value());

    } else {
      error = true;
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<ScriptAstNode>(statements);
}